

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O3

spv_result_t spvtools::val::MemoryPass(ValidationState_t *_,Instruction *inst)

{
  CapabilitySet *pCVar1;
  pointer puVar2;
  ushort uVar3;
  short sVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  pointer puVar7;
  undefined4 id;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  TensorAddressingOperandsMask TVar14;
  uint uVar15;
  AddressingModel AVar16;
  StorageClass SVar17;
  int32_t iVar18;
  uint32_t uVar19;
  spv_result_t sVar20;
  uint uVar21;
  long *plVar22;
  Function *pFVar23;
  undefined8 *puVar24;
  Instruction *pIVar25;
  Instruction *pIVar26;
  DiagnosticStream *pDVar27;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Instruction *pIVar28;
  byte bVar29;
  size_type *psVar30;
  ulong uVar31;
  byte bVar32;
  uint32_t id_00;
  long lVar33;
  byte bVar34;
  size_t sVar35;
  _Any_data *p_Var36;
  char *pcVar37;
  byte bVar38;
  Op opcode;
  ulong uVar39;
  undefined8 uVar40;
  byte bVar41;
  int iVar42;
  string instr_name;
  uint64_t array_length;
  uint64_t dim_value;
  uint32_t data_type;
  string errorVUID;
  undefined1 local_298 [34];
  byte local_276;
  byte local_275;
  byte local_274;
  byte local_273;
  byte local_272;
  char local_271;
  _Any_data local_270;
  undefined1 local_260 [32];
  ValidationState_t *local_240;
  _Any_data local_238;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  _Hash_node_base local_208;
  code *local_200;
  spv_result_t local_48;
  size_type local_40;
  __node_base local_38;
  
  uVar3 = (inst->inst_).opcode;
  opcode = (Op)uVar3;
  if (0x1141 < uVar3) {
    if (uVar3 < 0x14ef) {
      switch(uVar3) {
      case 0x1142:
        goto switchD_0018ad80_caseD_1142;
      case 0x1143:
      case 0x1144:
        goto switchD_0018ad80_caseD_1143;
      case 0x1145:
      case 0x1146:
        break;
      case 0x1147:
      case 0x1148:
        goto switchD_0018ad80_caseD_1147;
      case 0x1149:
        goto switchD_0018ad80_caseD_1149;
      default:
        if (uVar3 - 0x1169 < 2) {
          if (opcode == OpCooperativeMatrixLoadKHR) {
            local_238._M_unused._M_object = "spv::Op::OpCooperativeMatrixLoadKHR";
            pIVar25 = inst;
          }
          else {
            uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,1);
            pIVar25 = ValidationState_t::FindDef(_,uVar15);
            local_238._M_unused._M_object = "spv::Op::OpCooperativeMatrixStoreKHR";
          }
          uVar19 = (pIVar25->inst_).type_id;
          pIVar25 = ValidationState_t::FindDef(_,uVar19);
          uVar5 = (inst->inst_).opcode;
          if ((pIVar25->inst_).opcode != 0x1168) {
            if (uVar5 == 0x1169) {
              ValidationState_t::diag
                        ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
              pcVar37 = "spv::Op::OpCooperativeMatrixLoadKHR Result Type <id> ";
              goto LAB_0018bdaf;
            }
            ValidationState_t::diag
                      ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
            pcVar37 = "spv::Op::OpCooperativeMatrixStoreKHR Object type <id> ";
            lVar33 = 0x36;
            goto LAB_0018c16c;
          }
          uVar15 = Instruction::GetOperandAs<unsigned_int>
                             (inst,(ulong)((uint)(uVar5 == 0x1169) * 2));
          pIVar25 = ValidationState_t::FindDef(_,uVar15);
          if (pIVar25 == (Instruction *)0x0) {
LAB_0018c57c:
            ValidationState_t::diag
                      ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
            p_Var36 = &local_238;
            goto LAB_0018c59c;
          }
          AVar16 = ValidationState_t::addressing_model(_);
          if (AVar16 == AddressingModelLogical) {
            bVar10 = (_->features_).variable_pointers;
            if ((bool)bVar10 == false) {
              iVar18 = spvOpcodeReturnsLogicalPointer((uint)(pIVar25->inst_).opcode);
              if (iVar18 == 0) goto LAB_0018c57c;
              bVar10 = (_->features_).variable_pointers;
            }
            if (((bVar10 & 1) != 0) &&
               (bVar8 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar25->inst_).opcode),
               !bVar8)) goto LAB_0018c57c;
          }
          uVar19 = (pIVar25->inst_).type_id;
          local_260._24_4_ = uVar19;
          pIVar26 = ValidationState_t::FindDef(_,uVar19);
          if ((pIVar26 == (Instruction *)0x0) ||
             ((uVar5 = (pIVar26->inst_).opcode, uVar5 != 0x20 && (uVar5 != 0x1141)))) {
            ValidationState_t::diag
                      ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
            p_Var36 = &local_238;
            goto LAB_0018c3de;
          }
          SVar17 = Instruction::GetOperandAs<spv::StorageClass>(pIVar26,1);
          bVar8 = spvIsVulkanEnv(_->context_->target_env);
          if ((((!bVar8) || (SVar17 == StorageClassWorkgroup)) || (SVar17 == StorageBuffer)) ||
             (SVar17 == PhysicalStorageBuffer)) {
            if (uVar5 != 0x1141) {
              uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar26,2);
              pIVar26 = ValidationState_t::FindDef(_,uVar15);
              if ((pIVar26 == (Instruction *)0x0) ||
                 ((bVar8 = ValidationState_t::IsIntScalarOrVectorType(_,uVar15), !bVar8 &&
                  (bVar8 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar15), !bVar8)))) {
                ValidationState_t::diag
                          ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
                p_Var36 = &local_238;
                goto LAB_0018d3b8;
              }
            }
            uVar15 = Instruction::GetOperandAs<unsigned_int>
                               (inst,(ulong)((inst->inst_).opcode == 0x1169) | 2);
            pIVar25 = ValidationState_t::FindDef(_,uVar15);
            if (((pIVar25 == (Instruction *)0x0) ||
                (bVar8 = ValidationState_t::IsIntScalarType(_,(pIVar25->inst_).type_id), !bVar8)) ||
               (iVar18 = spvOpcodeIsConstant((uint)(pIVar25->inst_).opcode), iVar18 == 0)) {
              pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
              ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar27,"MemoryLayout operand <id> ",0x1a);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
              pcVar37 = " must be a 32-bit integer constant instruction.";
              lVar33 = 0x2f;
              goto LAB_0018c654;
            }
            bVar8 = ValidationState_t::EvalConstantValUint64
                              (_,uVar15,(uint64_t *)local_270._M_pod_data);
            uVar5 = (inst->inst_).opcode;
            sVar35 = (ulong)(uVar5 == 0x1169) + 3;
            uVar39 = (long)(inst->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(inst->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4;
            if (sVar35 < uVar39) {
              uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,sVar35);
              pIVar25 = ValidationState_t::FindDef(_,uVar15);
              if ((pIVar25 == (Instruction *)0x0) ||
                 (bVar8 = ValidationState_t::IsIntScalarType(_,(pIVar25->inst_).type_id), !bVar8))
              goto LAB_0018d04b;
              uVar5 = (inst->inst_).opcode;
              uVar39 = (long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4;
            }
            else if (bVar8 && local_270._M_unused._M_object < (ValidationState_t *)0x2) {
              pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
              ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar27,"MemoryLayout ",0xd);
              std::ostream::_M_insert<unsigned_long>((ulong)pDVar27);
              pcVar37 = " requires a Stride.";
              lVar33 = 0x13;
              goto LAB_0018c52d;
            }
            uVar15 = uVar5 == 0x1169 | 4;
            if ((uVar39 <= uVar15) ||
               (sVar20 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar15), sVar20 == SPV_SUCCESS)) {
              sVar20 = SPV_SUCCESS;
            }
            goto joined_r0x0018c68c;
          }
          pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
          ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)local_298,_,0x230d,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
          pDVar27 = DiagnosticStream::operator<<(pDVar27,(char **)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27," storage class for pointer type <id> ",0x25);
          id_00 = local_260._24_4_;
LAB_0018d5ee:
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,id_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_270._M_unused._0_8_,local_270._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,
                     " is not Workgroup, StorageBuffer, or PhysicalStorageBuffer.",0x3b);
          local_48 = pDVar27->error_;
LAB_0018d620:
          local_228._0_8_ = local_260._0_8_;
          uVar40 = local_270._M_unused._0_8_;
          sVar20 = local_48;
          if ((ValidationState_t *)local_270._M_unused._0_8_ == (ValidationState_t *)local_260)
          goto LAB_0018c66b;
LAB_0018d62f:
          operator_delete((void *)uVar40,
                          (ulong)((long)&((spv_const_context)local_228._0_8_)->target_env + 1));
          goto LAB_0018c66b;
        }
        if (opcode == OpCooperativeMatrixLengthKHR) goto LAB_0018b6c3;
      }
      goto switchD_0018ad80_caseD_1145;
    }
    if (uVar3 < 0x14f7) {
      if (uVar3 - 0x14ef < 2) {
        if (opcode == OpCooperativeMatrixLoadNV) {
          local_270._M_unused._M_object = "spv::Op::OpCooperativeMatrixLoadNV";
          pIVar25 = inst;
        }
        else {
          uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,1);
          pIVar25 = ValidationState_t::FindDef(_,uVar15);
          local_270._M_unused._M_object = "spv::Op::OpCooperativeMatrixStoreNV";
        }
        uVar19 = (pIVar25->inst_).type_id;
        pIVar25 = ValidationState_t::FindDef(_,uVar19);
        uVar5 = (inst->inst_).opcode;
        if ((pIVar25->inst_).opcode != 0x14ee) {
          if (uVar5 == 0x14ef) {
            ValidationState_t::diag
                      ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
            pcVar37 = "spv::Op::OpCooperativeMatrixLoadNV Result Type <id> ";
            lVar33 = 0x34;
          }
          else {
            ValidationState_t::diag
                      ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
            pcVar37 = "spv::Op::OpCooperativeMatrixStoreNV Object type <id> ";
LAB_0018bdaf:
            lVar33 = 0x35;
          }
          goto LAB_0018c16c;
        }
        uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((uint)(uVar5 == 0x14ef) * 2));
        pIVar25 = ValidationState_t::FindDef(_,uVar15);
        if (pIVar25 != (Instruction *)0x0) {
          AVar16 = ValidationState_t::addressing_model(_);
          if (AVar16 == AddressingModelLogical) {
            bVar10 = (_->features_).variable_pointers;
            if ((bool)bVar10 == false) {
              iVar18 = spvOpcodeReturnsLogicalPointer((uint)(pIVar25->inst_).opcode);
              if (iVar18 == 0) goto LAB_0018c311;
              bVar10 = (_->features_).variable_pointers;
            }
            if (((bVar10 & 1) != 0) &&
               (bVar8 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar25->inst_).opcode),
               !bVar8)) goto LAB_0018c311;
          }
          uVar19 = (pIVar25->inst_).type_id;
          pIVar26 = ValidationState_t::FindDef(_,uVar19);
          if ((pIVar26 != (Instruction *)0x0) && ((pIVar26->inst_).opcode == 0x20)) {
            SVar17 = Instruction::GetOperandAs<spv::StorageClass>(pIVar26,1);
            if (((SVar17 == StorageClassWorkgroup) || (SVar17 == StorageBuffer)) ||
               (SVar17 == PhysicalStorageBuffer)) {
              uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar26,2);
              pIVar26 = ValidationState_t::FindDef(_,uVar15);
              if ((pIVar26 != (Instruction *)0x0) &&
                 ((bVar8 = ValidationState_t::IsIntScalarOrVectorType(_,uVar15), bVar8 ||
                  (bVar8 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar15), bVar8)))) {
                uVar15 = Instruction::GetOperandAs<unsigned_int>
                                   (inst,(ulong)((inst->inst_).opcode == 0x14ef) | 2);
                pIVar25 = ValidationState_t::FindDef(_,uVar15);
                if ((pIVar25 == (Instruction *)0x0) ||
                   (bVar8 = ValidationState_t::IsIntScalarType(_,(pIVar25->inst_).type_id), !bVar8))
                {
LAB_0018d04b:
                  ValidationState_t::diag
                            ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_228 + 0x10),"Stride operand <id> ",0x14);
                  goto LAB_0018d709;
                }
                uVar15 = Instruction::GetOperandAs<unsigned_int>
                                   (inst,(ulong)((inst->inst_).opcode == 0x14ef) + 3);
                pIVar25 = ValidationState_t::FindDef(_,uVar15);
                if (((pIVar25 == (Instruction *)0x0) ||
                    (bVar8 = ValidationState_t::IsBoolScalarType(_,(pIVar25->inst_).type_id), !bVar8
                    )) || ((iVar18 = spvOpcodeIsConstant((uint)(pIVar25->inst_).opcode), iVar18 == 0
                           && (iVar18 = spvOpcodeIsSpecConstant((uint)(pIVar25->inst_).opcode),
                              iVar18 == 0)))) {
                  pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
                  ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar27,"Column Major operand <id> ",0x1a);
                  ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
                  pcVar37 = " must be a boolean constant instruction.";
                  lVar33 = 0x28;
                  goto LAB_0018c654;
                }
                uVar15 = (inst->inst_).opcode == 0x14ef | 4;
                if ((ulong)uVar15 <
                    (ulong)((long)(inst->operands_).
                                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(inst->operands_).
                                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4)) {
                  sVar20 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar15);
                  goto joined_r0x0018c68c;
                }
                goto switchD_0018ad80_caseD_1145;
              }
              ValidationState_t::diag
                        ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
              p_Var36 = &local_270;
LAB_0018d3b8:
              pDVar27 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)(local_228 + 0x10),(char **)p_Var36);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar27," Pointer <id> ",0xe);
              ValidationState_t::getIdName_abi_cxx11_
                        ((string *)local_298,_,(pIVar25->inst_).result_id);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
              pcVar37 = "s Type must be a scalar or vector type.";
              lVar33 = 0x27;
            }
            else {
              ValidationState_t::diag
                        ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
              pDVar27 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)(local_228 + 0x10),(char **)&local_270);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar27," storage class for pointer type <id> ",0x25);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar19);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
              pcVar37 = " is not Workgroup or StorageBuffer.";
              lVar33 = 0x23;
            }
            goto LAB_0018c5e6;
          }
          ValidationState_t::diag
                    ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
          p_Var36 = &local_270;
LAB_0018c3de:
          pDVar27 = DiagnosticStream::operator<<
                              ((DiagnosticStream *)(local_228 + 0x10),(char **)p_Var36);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27," type for pointer <id> ",0x17);
LAB_0018c408:
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
          pcVar37 = " is not a pointer type.";
          lVar33 = 0x17;
          goto LAB_0018c5e6;
        }
LAB_0018c311:
        ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
        p_Var36 = &local_270;
LAB_0018c59c:
        pDVar27 = DiagnosticStream::operator<<
                            ((DiagnosticStream *)(local_228 + 0x10),(char **)p_Var36);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27," Pointer <id> ",0xe);
LAB_0018c5c6:
        ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
        pcVar37 = " is not a logical pointer.";
        lVar33 = 0x1a;
        goto LAB_0018c5e6;
      }
      if (opcode != OpCooperativeMatrixLengthNV) goto switchD_0018ad80_caseD_1145;
LAB_0018b6c3:
      pcVar37 = spvOpcodeString(opcode);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_228 + 0x10),pcVar37,(allocator<char> *)local_270._M_pod_data);
      puVar24 = (undefined8 *)
                std::__cxx11::string::replace((ulong)(local_228 + 0x10),0,(char *)0x0,0x362138);
      local_298._0_8_ = local_298 + 0x10;
      psVar30 = puVar24 + 2;
      if ((size_type *)*puVar24 == psVar30) {
        local_298._16_8_ = *psVar30;
        local_298._24_8_ = puVar24[3];
      }
      else {
        local_298._16_8_ = *psVar30;
        local_298._0_8_ = (size_type *)*puVar24;
      }
      local_298._8_8_ = puVar24[1];
      *puVar24 = psVar30;
      puVar24[1] = 0;
      *(undefined1 *)(puVar24 + 2) = 0;
      if ((_Hash_node_base *)local_218._0_8_ != &local_208) {
        operator_delete((void *)local_218._0_8_,(ulong)((long)&(local_208._M_nxt)->_M_nxt + 1));
      }
      pIVar25 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
      if ((((pIVar25->inst_).opcode != 0x15) ||
          (uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar25,1), uVar15 != 0x20)) ||
         (uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar25,2), uVar15 != 0))
      goto LAB_0018bcd8;
      uVar5 = (inst->inst_).opcode;
      uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar25 = ValidationState_t::FindDef(_,uVar15);
      uVar6 = (pIVar25->inst_).opcode;
      if (uVar5 == 0x116c) {
        if (uVar6 == 0x1168) {
LAB_0018cb66:
          sVar20 = SPV_SUCCESS;
          goto LAB_0018bd91;
        }
        pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
        ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27,"The type in ",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27," <id> ",6);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,uVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,(char *)local_270._M_unused._0_8_,local_270._8_8_);
        pcVar37 = " must be OpTypeCooperativeMatrixKHR.";
        lVar33 = 0x24;
      }
      else {
        if (uVar6 == 0x14ee) goto LAB_0018cb66;
        pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
        ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27,"The type in ",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27," <id> ",6);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,uVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,(char *)local_270._M_unused._0_8_,local_270._8_8_);
        pcVar37 = " must be OpTypeCooperativeMatrixNV.";
        lVar33 = 0x23;
      }
      goto LAB_0018bd5b;
    }
    if (1 < uVar3 - 0x14f7) {
      if (uVar3 != 0x1516) goto switchD_0018ad80_caseD_1145;
      local_238._M_unused._M_object = inst;
      pcVar37 = spvOpcodeString(OpRawAccessChainNV);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_228 + 0x10),pcVar37,(allocator<char> *)local_270._M_pod_data);
      puVar24 = (undefined8 *)
                std::__cxx11::string::replace((ulong)(local_228 + 0x10),0,(char *)0x0,0x362138);
      psVar30 = puVar24 + 2;
      if ((size_type *)*puVar24 == psVar30) {
        local_298._16_8_ = *psVar30;
        local_298._24_8_ = puVar24[3];
        local_298._0_8_ = local_298 + 0x10;
      }
      else {
        local_298._16_8_ = *psVar30;
        local_298._0_8_ = (size_type *)*puVar24;
      }
      local_298._8_8_ = puVar24[1];
      *puVar24 = psVar30;
      puVar24[1] = 0;
      *(undefined1 *)(puVar24 + 2) = 0;
      if ((_Hash_node_base *)local_218._0_8_ != &local_208) {
        operator_delete((void *)local_218._0_8_,(ulong)((long)&(local_208._M_nxt)->_M_nxt + 1));
      }
      pIVar25 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
      if ((pIVar25->inst_).opcode == 0x20) {
        SVar17 = Instruction::GetOperandAs<spv::StorageClass>(pIVar25,1);
        if (((SVar17 != StorageClassUniform) && (SVar17 != StorageBuffer)) &&
           (SVar17 != PhysicalStorageBuffer)) {
          pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
          ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,"The Result Type of ",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_270._M_unused._0_8_,local_270._8_8_);
          pcVar37 = 
          " must point to a storage class of StorageBuffer, PhysicalStorageBuffer, or Uniform.";
          lVar33 = 0x53;
LAB_0018c8d9:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_228 + 0x10),pcVar37,lVar33);
          goto LAB_0018c8e8;
        }
        uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar25,2);
        pIVar25 = ValidationState_t::FindDef(_,uVar15);
        uVar15 = (uint)(pIVar25->inst_).opcode;
        if ((uVar15 < 0x1f) && ((0x51000000U >> (uVar15 & 0x1f) & 1) != 0)) {
          pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
          ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,"The Result Type of ",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_270._M_unused._0_8_,local_270._8_8_);
          pcVar37 = " must not point to OpTypeArray, OpTypeMatrix, or OpTypeStruct.";
          lVar33 = 0x3e;
          goto LAB_0018c8d9;
        }
        uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,3);
        pIVar25 = ValidationState_t::FindDef(_,uVar15);
        if ((pIVar25->inst_).opcode != 0x2b) {
          pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
          ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,"The Stride of ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_270._M_unused._0_8_,local_270._8_8_);
          pcVar37 = " must be OpConstant. Found Op";
          lVar33 = 0x1d;
          goto LAB_0018c115;
        }
        pIVar26 = ValidationState_t::FindDef(_,(pIVar25->inst_).type_id);
        if ((pIVar26->inst_).opcode != 0x15) {
          pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
          ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,"The type of Stride of ",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_270._M_unused._0_8_,local_270._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27," must be OpTypeInt. Found Op",0x1c);
          uVar3 = (pIVar26->inst_).opcode;
          goto LAB_0018c123;
        }
        local_270._8_8_ = &local_238;
        local_270._M_unused._M_object = _;
        local_260._0_8_ = (spv_const_context)local_298;
        sVar20 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                           ((anon_class_24_3_e757d3e0 *)&local_270,"Index",4);
        if ((sVar20 == SPV_SUCCESS) &&
           (sVar20 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                               ((anon_class_24_3_e757d3e0 *)&local_270,"Offset",5),
           sVar20 == SPV_SUCCESS)) {
          sVar20 = SPV_SUCCESS;
          if (*(long *)(local_238._M_unused._M_function_pointer + 0x20) -
              *(size_t *)(local_238._M_unused._M_function_pointer + 0x18) < 0x61) goto LAB_0018c90f;
          uVar15 = Instruction::GetOperandAs<unsigned_int>
                             ((Instruction *)local_238._M_unused._0_8_,6);
          if ((uVar15 & 2) == 0) {
LAB_0018e238:
            if ((uVar15 & 1) == 0) {
              if ((SVar17 == PhysicalStorageBuffer & (byte)((uVar15 & 2) >> 1)) != 0) {
LAB_0018e43e:
                ValidationState_t::diag
                          ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_DATA,
                           (Instruction *)local_238._M_unused._0_8_);
                pcVar37 = 
                "Storage class cannot be PhysicalStorageBuffer when raw access chain robustness is used."
                ;
                lVar33 = 0x57;
                goto LAB_0018e467;
              }
            }
            else {
              if (SVar17 == PhysicalStorageBuffer) goto LAB_0018e43e;
              sVar20 = SPV_SUCCESS;
              if ((uVar15 & 2) != 0) {
                ValidationState_t::diag
                          ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_DATA,
                           (Instruction *)local_238._M_unused._0_8_);
                pcVar37 = 
                "Per-component robustness and per-element robustness are mutually exclusive.";
                lVar33 = 0x4b;
                goto LAB_0018e467;
              }
            }
            goto LAB_0018c90f;
          }
          local_240 = (ValidationState_t *)0x0;
          bVar8 = ValidationState_t::EvalConstantValUint64
                            (_,(pIVar25->inst_).result_id,(uint64_t *)&local_240);
          if ((!bVar8) || (local_240 != (ValidationState_t *)0x0)) goto LAB_0018e238;
          ValidationState_t::diag
                    ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_DATA,
                     (Instruction *)local_238._M_unused._0_8_);
          pcVar37 = "Stride must not be zero when per-element robustness is used.";
          lVar33 = 0x3c;
LAB_0018e467:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_228 + 0x10),pcVar37,lVar33);
          goto LAB_0018c90a;
        }
      }
      else {
        pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
        ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,"The Result Type of ",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27," <id> ",6);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,(char *)local_270._M_unused._0_8_,local_270._8_8_);
        pcVar37 = " must be OpTypePointer. Found Op";
        lVar33 = 0x20;
LAB_0018c115:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_228 + 0x10),pcVar37,lVar33);
        uVar3 = (pIVar25->inst_).opcode;
LAB_0018c123:
        local_240 = (ValidationState_t *)spvOpcodeString((uint)uVar3);
        pDVar27 = DiagnosticStream::operator<<
                            ((DiagnosticStream *)(local_228 + 0x10),(char **)&local_240);
        local_271 = '.';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27,&local_271,1);
        local_48 = pDVar27->error_;
LAB_0018c8e8:
        if ((ValidationState_t *)local_270._M_unused._0_8_ != (ValidationState_t *)local_260) {
          operator_delete(local_270._M_unused._M_object,
                          (ulong)((long)(spv_target_env *)local_260._0_8_ + 1));
        }
LAB_0018c90a:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)(local_228 + 0x10));
        sVar20 = local_48;
      }
LAB_0018c90f:
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) goto LAB_0018c91c;
      goto joined_r0x0018c68c;
    }
    if (opcode == OpCooperativeMatrixLoadTensorNV) {
      local_238._M_unused._M_object = "spv::Op::OpCooperativeMatrixLoadTensorNV";
      pIVar25 = inst;
    }
    else {
      uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      pIVar25 = ValidationState_t::FindDef(_,uVar15);
      local_238._M_unused._M_object = "spv::Op::OpCooperativeMatrixStoreTensorNV";
    }
    uVar19 = (pIVar25->inst_).type_id;
    pIVar25 = ValidationState_t::FindDef(_,uVar19);
    uVar5 = (inst->inst_).opcode;
    if ((pIVar25->inst_).opcode != 0x1168) {
      if (uVar5 == 0x14f7) {
        ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
        pcVar37 = "spv::Op::OpCooperativeMatrixLoadTensorNV Result Type <id> ";
        lVar33 = 0x3a;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
        pcVar37 = "spv::Op::OpCooperativeMatrixStoreTensorNV Object type <id> ";
        lVar33 = 0x3b;
      }
LAB_0018c16c:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_228 + 0x10),pcVar37,lVar33);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_228 + 0x10),(char *)local_298._0_8_,local_298._8_8_);
      pcVar37 = " is not a cooperative matrix type.";
      lVar33 = 0x22;
      goto LAB_0018c654;
    }
    uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((uint)(uVar5 == 0x14f7) * 2));
    pIVar26 = ValidationState_t::FindDef(_,uVar15);
    if (pIVar26 == (Instruction *)0x0) {
LAB_0018c36e:
      ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
      pDVar27 = DiagnosticStream::operator<<
                          ((DiagnosticStream *)(local_228 + 0x10),(char **)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27," Pointer <id> ",0xe);
      goto LAB_0018c5c6;
    }
    AVar16 = ValidationState_t::addressing_model(_);
    if (AVar16 == AddressingModelLogical) {
      bVar10 = (_->features_).variable_pointers;
      if ((bool)bVar10 == false) {
        iVar18 = spvOpcodeReturnsLogicalPointer((uint)(pIVar26->inst_).opcode);
        if (iVar18 == 0) goto LAB_0018c36e;
        bVar10 = (_->features_).variable_pointers;
      }
      if (((bVar10 & 1) != 0) &&
         (bVar8 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar26->inst_).opcode), !bVar8))
      goto LAB_0018c36e;
    }
    id_00 = (pIVar26->inst_).type_id;
    pIVar26 = ValidationState_t::FindDef(_,id_00);
    if ((pIVar26 == (Instruction *)0x0) || ((pIVar26->inst_).opcode != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
      pDVar27 = DiagnosticStream::operator<<
                          ((DiagnosticStream *)(local_228 + 0x10),(char **)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27," type for pointer <id> ",0x17);
      goto LAB_0018c408;
    }
    SVar17 = Instruction::GetOperandAs<spv::StorageClass>(pIVar26,1);
    if (((SVar17 != StorageClassWorkgroup) && (SVar17 != StorageBuffer)) &&
       (SVar17 != PhysicalStorageBuffer)) {
      pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
      ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)local_298,_,0x230d,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
      pDVar27 = DiagnosticStream::operator<<(pDVar27,(char **)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27," storage class for pointer type <id> ",0x25);
      goto LAB_0018d5ee;
    }
    sVar35 = 2;
    if ((inst->inst_).opcode == 0x14f7) {
      uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,3);
      pIVar26 = ValidationState_t::FindDef(_,uVar15);
      if ((pIVar26 == (Instruction *)0x0) || ((pIVar26->inst_).type_id != uVar19)) {
        ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
        pDVar27 = DiagnosticStream::operator<<
                            ((DiagnosticStream *)(local_228 + 0x10),(char **)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27," Object <id> ",0xd);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
        pcVar37 = " type does not match Result Type.";
        lVar33 = 0x21;
        goto LAB_0018c5e6;
      }
      sVar35 = (ulong)((inst->inst_).opcode == 0x14f7) * 2 + 2;
    }
    uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,sVar35);
    pFVar23 = (Function *)ValidationState_t::FindDef(_,uVar15);
    if ((pFVar23 == (Function *)0x0) ||
       (pIVar26 = ValidationState_t::FindDef
                            (_,(uint32_t)(pFVar23->blocks_)._M_h._M_rehash_policy._M_next_resize),
       (pIVar26->inst_).opcode != 0x14fa)) {
      ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
      pDVar27 = DiagnosticStream::operator<<
                          ((DiagnosticStream *)(local_228 + 0x10),(char **)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27," TensorLayout <id> ",0x13);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
      pcVar37 = " does not have a tensor layout type.";
      lVar33 = 0x24;
LAB_0018c5e6:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27,pcVar37,lVar33);
      sVar20 = pDVar27->error_;
      goto LAB_0018c66b;
    }
    uVar15 = (uint)((inst->inst_).opcode == 0x14f7) * 2 + 3;
    if (((ulong)uVar15 <
         (ulong)((long)(inst->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(inst->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4)) &&
       (sVar20 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar15), sVar20 != SPV_SUCCESS)) {
      return sVar20;
    }
    local_260._24_8_ = pFVar23;
    uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar15);
    iVar42 = ((uVar13 >> 3 & 1) + uVar15 + (uint)((uVar13 >> 4 & 1) != 0)) -
             (uint)((uVar13 & 2) == 0);
    TVar14 = Instruction::GetOperandAs<spv::TensorAddressingOperandsMask>(inst,(ulong)(iVar42 + 2U))
    ;
    if ((ulong)((TVar14 & TensorView) + TensorView + iVar42 + 2U + (uint)((TVar14 >> 1 & 1) != 0))
        <= (ulong)((long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4)) {
      uVar15 = iVar42 + 3;
      if ((TVar14 & TensorView) != MaskNone) {
        uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar15);
        pIVar26 = ValidationState_t::FindDef(_,uVar15);
        if ((pIVar26 == (Instruction *)0x0) ||
           (pIVar26 = ValidationState_t::FindDef(_,(pIVar26->inst_).type_id),
           (pIVar26->inst_).opcode != 0x14fb)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
          pDVar27 = DiagnosticStream::operator<<
                              ((DiagnosticStream *)(local_228 + 0x10),(char **)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27," TensorView <id> ",0x11);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
          pcVar37 = " does not have a tensor view type.";
          lVar33 = 0x22;
          goto LAB_0018c5e6;
        }
        uVar15 = iVar42 + 4;
      }
      if ((TVar14 & DecodeFunc) == MaskNone) goto switchD_0018ad80_caseD_1145;
      if ((inst->inst_).opcode == 0x14f8) {
        ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
        pcVar37 = "OpCooperativeMatrixStoreTensorNV does not support DecodeFunc.";
        lVar33 = 0x3d;
        goto LAB_0018c52d;
      }
      uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar15);
      pIVar26 = ValidationState_t::FindDef(_,uVar15);
      if ((pIVar26 == (Instruction *)0x0) || ((pIVar26->inst_).opcode != 0x36)) {
        ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
        pDVar27 = DiagnosticStream::operator<<
                            ((DiagnosticStream *)(local_228 + 0x10),(char **)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27," DecodeFunc <id> ",0x11);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
        pcVar37 = " is not a function.";
        lVar33 = 0x13;
      }
      else {
        uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar25,1);
        uVar21 = Instruction::GetOperandAs<unsigned_int>(pIVar26,3);
        pIVar25 = ValidationState_t::FindDef(_,uVar21);
        uVar21 = Instruction::GetOperandAs<unsigned_int>(pIVar25,1);
        if (uVar21 == uVar13) {
          uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar25,2);
          pIVar26 = ValidationState_t::FindDef(_,uVar13);
          SVar17 = Instruction::GetOperandAs<spv::StorageClass>(pIVar26,1);
          if (SVar17 == PhysicalStorageBuffer) {
            pIVar26 = ValidationState_t::FindDef
                                (_,(uint32_t)
                                   (((unordered_map<unsigned_int,_spvtools::val::BasicBlock,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>_>
                                      *)(local_260._24_8_ + 0x18))->_M_h)._M_rehash_policy.
                                   _M_next_resize);
            sVar35 = 3;
            do {
              uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar25,sVar35);
              pIVar28 = ValidationState_t::FindDef(_,uVar13);
              if ((pIVar28->inst_).opcode != 0x1c) {
LAB_0018e8cc:
                ValidationState_t::diag
                          ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
                pDVar27 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)(local_228 + 0x10),(char **)&local_238);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar27," DecodeFunc <id> ",0x11);
                ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar27,
                           " second/third parameter must be array of 32-bit integer with ",0x3d);
                pcVar37 = " dimension equal to the tensor dimension.";
                lVar33 = 0x29;
                goto LAB_0018c5e6;
              }
              uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar28,2);
              bVar8 = ValidationState_t::EvalConstantValUint64
                                (_,uVar13,(uint64_t *)local_270._M_pod_data);
              if (bVar8) {
                uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar26,1);
                bVar8 = ValidationState_t::EvalConstantValUint64(_,uVar13,(uint64_t *)&local_240);
                if ((bVar8) && ((ValidationState_t *)local_270._M_unused._0_8_ != local_240))
                goto LAB_0018e8cc;
              }
              sVar35 = sVar35 + 1;
            } while (sVar35 != 5);
            goto switchD_0018ad80_caseD_1145;
          }
          ValidationState_t::diag
                    ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
          pDVar27 = DiagnosticStream::operator<<
                              ((DiagnosticStream *)(local_228 + 0x10),(char **)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27," DecodeFunc <id> ",0x11);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
          pcVar37 = " first parameter must be pointer to PhysicalStorageBuffer.";
          lVar33 = 0x3a;
        }
        else {
          ValidationState_t::diag
                    ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
          pDVar27 = DiagnosticStream::operator<<
                              ((DiagnosticStream *)(local_228 + 0x10),(char **)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27," DecodeFunc <id> ",0x11);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
          pcVar37 = " return type must match matrix component type.";
          lVar33 = 0x2e;
        }
      }
      goto LAB_0018c5e6;
    }
    ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
    pDVar27 = DiagnosticStream::operator<<
                        ((DiagnosticStream *)(local_228 + 0x10),(char **)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar27," not enough tensor addressing operands.",0x27);
    sVar20 = pDVar27->error_;
    goto LAB_0018c685;
  }
  switch(uVar3) {
  case 0x3b:
switchD_0018ad80_caseD_1142:
    sVar20 = anon_unknown_2::ValidateVariable(_,inst);
    break;
  case 0x3c:
  case 0x45:
    goto switchD_0018ad80_caseD_1145;
  case 0x3d:
    pIVar25 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if (pIVar25 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_228 + 0x10),"OpLoad Result Type <id> ",0x18);
      uVar19 = (inst->inst_).type_id;
      goto LAB_0018c255;
    }
    uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar26 = ValidationState_t::FindDef(_,uVar15);
    if (pIVar26 == (Instruction *)0x0) {
LAB_0018c7e6:
      pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
      ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27,"OpLoad Pointer <id> ",0x14);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
      pcVar37 = " is not a logical pointer.";
      lVar33 = 0x1a;
    }
    else {
      AVar16 = ValidationState_t::addressing_model(_);
      if (AVar16 == AddressingModelLogical) {
        bVar10 = (_->features_).variable_pointers;
        if ((bool)bVar10 == false) {
          iVar18 = spvOpcodeReturnsLogicalPointer((uint)(pIVar26->inst_).opcode);
          if (iVar18 == 0) goto LAB_0018c7e6;
          bVar10 = (_->features_).variable_pointers;
        }
        if (((bVar10 & 1) != 0) &&
           (bVar8 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar26->inst_).opcode), !bVar8))
        goto LAB_0018c7e6;
      }
      pIVar28 = ValidationState_t::FindDef(_,(pIVar26->inst_).type_id);
      if (pIVar28 != (Instruction *)0x0) {
        uVar5 = (pIVar28->inst_).opcode;
        if (uVar5 == 0x20) {
          uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar28,2);
          pIVar28 = ValidationState_t::FindDef(_,uVar13);
          if ((pIVar28 == (Instruction *)0x0) ||
             ((pIVar25->inst_).result_id != (pIVar28->inst_).result_id)) {
            pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
            ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar27,"OpLoad Result Type <id> ",0x18);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,(inst->inst_).type_id);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar27," does not match Pointer <id> ",0x1d);
            uVar19 = (pIVar26->inst_).result_id;
LAB_0018d1ea:
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,uVar19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_228 + 0x10),(char *)local_270._M_unused._0_8_,
                       local_270._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_228 + 0x10),"s type.",7);
            goto LAB_0018d620;
          }
        }
        else if (uVar5 != 0x1141) goto LAB_0018b79f;
        if ((_->options_->before_hlsl_legalization == false) &&
           (bVar8 = ValidationState_t::ContainsRuntimeArray(_,(inst->inst_).type_id), bVar8)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
          pcVar37 = "Cannot load a runtime-sized array";
          lVar33 = 0x21;
        }
        else {
          sVar20 = anon_unknown_2::CheckMemoryAccess(_,inst,3);
          if (sVar20 != SPV_SUCCESS) {
            return sVar20;
          }
          bVar8 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
          if ((((!bVar8) ||
               (bVar8 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id)
               , !bVar8)) || (uVar3 = (pIVar25->inst_).opcode, uVar3 - 0x15 < 4)) || (uVar3 == 0x20)
             ) {
            ValidationState_t::RegisterQCOMImageProcessingTextureConsumer
                      (_,uVar15,inst,(Instruction *)0x0);
            goto switchD_0018ad80_caseD_1145;
          }
          ValidationState_t::diag
                    ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
          pcVar37 = "8- or 16-bit loads must be a scalar, vector or matrix type";
          lVar33 = 0x3a;
        }
        goto LAB_0018c52d;
      }
LAB_0018b79f:
      pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
      ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27,"OpLoad type for pointer <id> ",0x1d);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
      pcVar37 = " is not a pointer type.";
      lVar33 = 0x17;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_228 + 0x10),pcVar37,lVar33)
    ;
    sVar20 = local_48;
    goto LAB_0018c66b;
  case 0x3e:
    uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar25 = ValidationState_t::FindDef(_,uVar15);
    if (pIVar25 == (Instruction *)0x0) {
LAB_0018c4a7:
      pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
      ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27,"OpStore Pointer <id> ",0x15);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
      pcVar37 = " is not a logical pointer.";
LAB_0018c4fc:
      lVar33 = 0x1a;
    }
    else {
      AVar16 = ValidationState_t::addressing_model(_);
      if (AVar16 == AddressingModelLogical) {
        bVar10 = (_->features_).variable_pointers;
        if ((bool)bVar10 == false) {
          iVar18 = spvOpcodeReturnsLogicalPointer((uint)(pIVar25->inst_).opcode);
          if (iVar18 == 0) goto LAB_0018c4a7;
          bVar10 = (_->features_).variable_pointers;
        }
        if (((bVar10 & 1) != 0) &&
           (bVar8 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar25->inst_).opcode), !bVar8))
        goto LAB_0018c4a7;
      }
      pIVar26 = ValidationState_t::FindDef(_,(pIVar25->inst_).type_id);
      if (pIVar26 == (Instruction *)0x0) {
LAB_0018c27a:
        pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
        ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,"OpStore type for pointer <id> ",0x1e);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
        pcVar37 = " is not a pointer type.";
        lVar33 = 0x17;
      }
      else {
        uVar5 = (pIVar26->inst_).opcode;
        if (uVar5 == 0x20) {
          uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar26,2);
          pIVar28 = ValidationState_t::FindDef(_,uVar13);
          if ((pIVar28 != (Instruction *)0x0) && ((pIVar28->inst_).opcode != 0x13))
          goto LAB_0018c9b3;
          ValidationState_t::diag
                    ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_228 + 0x10),"OpStore Pointer <id> ",0x15);
LAB_0018c98e:
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_228 + 0x10),(char *)local_298._0_8_,local_298._8_8_);
          pcVar37 = "s type is void.";
          lVar33 = 0xf;
        }
        else {
          if (uVar5 != 0x1141) goto LAB_0018c27a;
          pIVar28 = (Instruction *)0x0;
LAB_0018c9b3:
          bVar8 = ValidationState_t::GetPointerTypeInfo
                            (_,(pIVar26->inst_).result_id,(uint32_t *)local_238._M_pod_data,
                             (StorageClass *)&local_240);
          if (bVar8) {
            if ((9 < (uint)local_240) || ((0x203U >> ((uint)local_240 & 0x1f) & 1) == 0)) {
              if ((uint)local_240 == 0x14db) {
                ValidationState_t::VkErrorID_abi_cxx11_
                          ((string *)(local_228 + 0x10),_,0x125f,(char *)0x0);
                local_260._24_8_ = ValidationState_t::function(_,inst->function_->id_);
                local_298._0_8_ = local_298 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_298,local_218._0_8_,
                           (long)(_Hash_node_base **)local_218._0_8_ + local_218._8_8_);
                local_270._8_8_ = (_Any_data *)0x0;
                local_270._M_unused._M_object = operator_new(0x20);
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &((ValidationState_t *)local_270._M_unused._0_8_)->context_)->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)&((ValidationState_t *)local_270._M_unused._0_8_)->words_;
                if ((undefined1 *)local_298._0_8_ == local_298 + 0x10) {
                  ((ValidationState_t *)local_270._M_unused._0_8_)->words_ =
                       (uint32_t *)local_298._16_8_;
                  (((vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *)
                   &((ValidationState_t *)local_270._M_unused._0_8_)->num_words_)->
                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>).
                  _M_impl.super__Vector_impl_data._M_start = (pointer)local_298._24_8_;
                }
                else {
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &((ValidationState_t *)local_270._M_unused._0_8_)->context_)->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start = (pointer)local_298._0_8_;
                  ((ValidationState_t *)local_270._M_unused._0_8_)->words_ =
                       (uint32_t *)local_298._16_8_;
                }
                ((ValidationState_t *)local_270._M_unused._0_8_)->options_ =
                     (spv_const_validator_options)local_298._8_8_;
                local_298._8_8_ = (spv_const_validator_options)0x0;
                local_298._16_8_ = local_298._16_8_ & 0xffffffffffffff00;
                local_260._8_8_ =
                     std::
                     _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_memory.cpp:1088:15)>
                     ::_M_invoke;
                local_260._0_8_ =
                     std::
                     _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_memory.cpp:1088:15)>
                     ::_M_manager;
                local_298._0_8_ = local_298 + 0x10;
                Function::RegisterExecutionModelLimitation
                          ((Function *)local_260._24_8_,
                           (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                            *)&local_270);
                if ((spv_const_context)local_260._0_8_ != (spv_const_context)0x0) {
                  (*(code *)local_260._0_8_)(&local_270,&local_270,3);
                }
                if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
                  operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
                }
                if ((_Hash_node_base *)local_218._0_8_ != &local_208) {
                  operator_delete((void *)local_218._0_8_,
                                  (ulong)((long)&(local_208._M_nxt)->_M_nxt + 1));
                }
              }
              else if ((uint)local_240 == 0x14df) {
                ValidationState_t::diag
                          ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
                pcVar37 = "ShaderRecordBufferKHR Storage Class variables are read only";
                goto LAB_0018d441;
              }
              bVar8 = spvIsVulkanEnv(_->context_->target_env);
              if (((bVar8) && ((uint)local_240 == 2)) &&
                 (pIVar25 = ValidationState_t::TracePointer(_,pIVar25),
                 (pIVar25->inst_).opcode == 0x3b)) {
                uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar25,0);
                pIVar25 = ValidationState_t::FindDef(_,uVar13);
                uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar25,2);
                pIVar25 = ValidationState_t::FindDef(_,uVar13);
                if (((pIVar25->inst_).opcode & 0xfffe) == 0x1c) {
                  uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar25,1);
                  pIVar25 = ValidationState_t::FindDef(_,uVar13);
                }
                bVar8 = ValidationState_t::HasDecoration(_,(pIVar25->inst_).result_id,Block);
                if (bVar8) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
                  ValidationState_t::VkErrorID_abi_cxx11_((string *)local_298,_,0x1b0d,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_228 + 0x10),(char *)local_298._0_8_,local_298._8_8_);
                  pcVar37 = "In the Vulkan environment, cannot store to Uniform Blocks";
                  lVar33 = 0x39;
                  goto LAB_0018c654;
                }
              }
              uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,1);
              pIVar25 = ValidationState_t::FindDef(_,uVar13);
              if ((pIVar25 == (Instruction *)0x0) ||
                 (uVar19 = (pIVar25->inst_).type_id, uVar19 == 0)) {
                pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
                ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar27,"OpStore Object <id> ",0x14);
                ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar13);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
                pcVar37 = " is not an object.";
                goto LAB_0018c64f;
              }
              pIVar26 = ValidationState_t::FindDef(_,uVar19);
              if ((pIVar26 == (Instruction *)0x0) ||
                 (uVar5 = (pIVar26->inst_).opcode, uVar5 == 0x13)) {
                ValidationState_t::diag
                          ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_228 + 0x10),"OpStore Object <id> ",0x14);
                uVar15 = uVar13;
                goto LAB_0018c98e;
              }
              if ((pIVar28 != (Instruction *)0x0) &&
                 ((pIVar28->inst_).result_id != (pIVar26->inst_).result_id)) {
                if ((_->options_->relax_struct_store == true) &&
                   ((uVar5 == 0x1e && ((pIVar28->inst_).opcode == 0x1e)))) {
                  bVar8 = anon_unknown_2::AreLayoutCompatibleStructs(_,pIVar28,pIVar26);
                  if (bVar8) goto LAB_0018df74;
                  pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
                  ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar27,"OpStore Pointer <id> ",0x15);
                  ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar27,"s layout does not match Object <id> ",0x24);
                  ValidationState_t::getIdName_abi_cxx11_
                            ((string *)&local_238,_,(pIVar25->inst_).result_id);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar27,(char *)local_238._M_unused._0_8_,local_238._8_8_);
                  pcVar37 = "s layout.";
                  lVar33 = 9;
                }
                else {
                  pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
                  ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar27,"OpStore Pointer <id> ",0x15);
                  ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar27,"s type does not match Object <id> ",0x22);
                  ValidationState_t::getIdName_abi_cxx11_
                            ((string *)&local_238,_,(pIVar25->inst_).result_id);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar27,(char *)local_238._M_unused._0_8_,local_238._8_8_);
                  pcVar37 = "s type.";
                  lVar33 = 7;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_228 + 0x10),pcVar37,lVar33);
                uVar40 = local_238._M_unused._0_8_;
                sVar20 = local_48;
                if ((ValidationState_t *)local_238._M_unused._0_8_ != (ValidationState_t *)local_228
                   ) goto LAB_0018d62f;
                goto LAB_0018c66b;
              }
LAB_0018df74:
              sVar20 = anon_unknown_2::CheckMemoryAccess(_,inst,2);
              if (sVar20 != SPV_SUCCESS) {
                return sVar20;
              }
              bVar8 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
              if ((((bVar8) &&
                   (bVar8 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                      (_,(inst->inst_).type_id), bVar8)) &&
                  (uVar3 = (pIVar26->inst_).opcode, 3 < uVar3 - 0x15)) && (uVar3 != 0x20)) {
                ValidationState_t::diag
                          ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
                pcVar37 = "8- or 16-bit stores must be a scalar, vector or matrix type";
                goto LAB_0018d441;
              }
              bVar8 = spvIsVulkanEnv(_->context_->target_env);
              if ((bVar8) && (_->options_->before_hlsl_legalization == false)) {
                local_218._0_8_ = (_Hash_node_base *)0x0;
                local_218._8_8_ = 0;
                local_200 = std::
                            _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_memory.cpp:1174:34)>
                            ::_M_invoke;
                local_208._M_nxt =
                     (_Hash_node_base *)
                     std::
                     _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_memory.cpp:1174:34)>
                     ::_M_manager;
                bVar8 = ValidationState_t::ContainsType
                                  (_,(pIVar26->inst_).result_id,
                                   (function<bool_(const_spvtools::val::Instruction_*)> *)
                                   (local_228 + 0x10),true);
                if (local_208._M_nxt != (_Hash_node_base *)0x0) {
                  (*(code *)local_208._M_nxt)(local_228 + 0x10,local_228 + 0x10,3);
                }
                if (bVar8) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
                  ValidationState_t::VkErrorID_abi_cxx11_((string *)local_298,_,0x1b0c,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_228 + 0x10),(char *)local_298._0_8_,local_298._8_8_);
                  pcVar37 = 
                  "Cannot store to OpTypeImage, OpTypeSampler, OpTypeSampledImage, or OpTypeAccelerationStructureKHR objects"
                  ;
                  lVar33 = 0x69;
                  goto LAB_0018c654;
                }
              }
              goto switchD_0018ad80_caseD_1145;
            }
            pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
            ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar27,"OpStore Pointer <id> ",0x15);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
            pcVar37 = " storage class is read-only";
LAB_0018cfd2:
            lVar33 = 0x1b;
          }
          else {
            pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
            ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar27,"OpStore Pointer <id> ",0x15);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
            pcVar37 = " is not pointer type";
            lVar33 = 0x14;
          }
        }
      }
    }
    goto LAB_0018c654;
  case 0x3f:
  case 0x40:
    uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar25 = ValidationState_t::FindDef(_,uVar19);
    if (pIVar25 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_228 + 0x10),"Target operand <id> ",0x14);
    }
    else {
      uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      pIVar26 = ValidationState_t::FindDef(_,uVar15);
      if (pIVar26 != (Instruction *)0x0) {
        pFVar23 = (Function *)ValidationState_t::FindDef(_,(pIVar25->inst_).type_id);
        if ((pFVar23 == (Function *)0x0) ||
           ((sVar4 = *(short *)((long)&(pFVar23->blocks_)._M_h._M_rehash_policy._M_max_load_factor +
                               2), sVar4 != 0x20 && (sVar4 != 0x1141)))) {
          ValidationState_t::diag
                    ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_228 + 0x10),"Target operand <id> ",0x14);
LAB_0018c634:
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar19);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_228 + 0x10),(char *)local_298._0_8_,local_298._8_8_);
          pcVar37 = " is not a pointer.";
LAB_0018c64f:
          lVar33 = 0x12;
          goto LAB_0018c654;
        }
        local_260._24_8_ = pFVar23;
        pIVar25 = ValidationState_t::FindDef(_,(pIVar26->inst_).type_id);
        if ((pIVar25 == (Instruction *)0x0) ||
           ((uVar5 = (pIVar25->inst_).opcode, uVar5 != 0x20 && (uVar5 != 0x1141)))) {
          ValidationState_t::diag
                    ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_228 + 0x10),"Source operand <id> ",0x14);
          uVar19 = uVar15;
          goto LAB_0018c634;
        }
        if ((inst->inst_).opcode != 0x3f) {
          uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,2);
          pIVar26 = ValidationState_t::FindDef(_,uVar19);
          if (pIVar26 == (Instruction *)0x0) {
            ValidationState_t::diag
                      ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
            pcVar37 = "Size operand <id> ";
            lVar33 = 0x12;
            goto LAB_0018befd;
          }
          local_260._20_4_ = uVar19;
          pIVar28 = ValidationState_t::FindDef(_,(pIVar26->inst_).type_id);
          bVar8 = ValidationState_t::IsIntScalarType(_,(pIVar28->inst_).result_id);
          id = local_260._20_4_;
          if (!bVar8) {
            ValidationState_t::diag
                      ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_228 + 0x10),"Size operand <id> ",0x12);
            uVar15 = local_260._20_4_;
LAB_0018d709:
            ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_228 + 0x10),(char *)local_298._0_8_,local_298._8_8_);
            pcVar37 = " must be a scalar integer type.";
            lVar33 = 0x1f;
            goto LAB_0018c654;
          }
          uVar5 = (pIVar26->inst_).opcode;
          if (uVar5 == 0x2b) {
            puVar7 = (pIVar26->words_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar33 = (long)(pIVar26->words_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)puVar7;
            if (((pIVar28->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[3] == 1) &&
               (*(int *)((long)puVar7 + lVar33 + -4) < 0)) {
              pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
              ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar27,"Size operand <id> ",0x12);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,local_260._20_4_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
              pcVar37 = " cannot have the sign bit set to 1.";
              lVar33 = 0x23;
              goto LAB_0018c654;
            }
            uVar31 = lVar33 >> 2;
            uVar39 = 3;
            if (uVar31 < 4) {
              uVar31 = 3;
            }
            do {
              if (uVar31 == uVar39) goto LAB_0018cf7d;
              puVar2 = puVar7 + uVar39;
              uVar39 = uVar39 + 1;
            } while (*puVar2 == 0);
LAB_0018da5f:
            pCVar1 = &_->module_capabilities_;
            bVar8 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityShader);
            if (bVar8) {
              ValidationState_t::EvalInt32IfConst
                        ((tuple<bool,_bool,_unsigned_int> *)(local_228 + 0x10),_,id);
              local_260._20_4_ = local_218._0_4_;
              if (((local_218._0_8_ & 3) != 0 & local_218[4]) == 1) {
                SVar17 = Instruction::GetOperandAs<spv::StorageClass>(pIVar25,1);
                local_40 = CONCAT44(extraout_var,SVar17);
                SVar17 = Instruction::GetOperandAs<spv::StorageClass>
                                   ((Instruction *)local_260._24_8_,1);
                local_38._M_nxt = (_Hash_node_base *)CONCAT44(extraout_var_00,SVar17);
                local_260[0x13] = EnumSet<spv::Capability>::contains(pCVar1,CapabilityInt8);
                bVar8 = EnumSet<spv::Capability>::contains
                                  (pCVar1,CapabilityUniformAndStorageBuffer8BitAccess);
                bVar9 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageBuffer8BitAccess)
                ;
                local_260[0x11] =
                     EnumSet<spv::Capability>::contains(pCVar1,CapabilityStoragePushConstant8);
                local_276 = EnumSet<spv::Capability>::contains
                                      (pCVar1,CapabilityWorkgroupMemoryExplicitLayout8BitAccessKHR);
                local_260[0x12] = EnumSet<spv::Capability>::contains(pCVar1,CapabilityInt16);
                bVar11 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageUniform16);
                local_274 = bVar8 || bVar11;
                local_273 = bVar8;
                bVar12 = EnumSet<spv::Capability>::contains
                                   (pCVar1,CapabilityStorageBuffer16BitAccess);
                bVar11 = (bVar12 || bVar11) || (bVar9 || bVar8);
                local_275 = bVar9 || bVar8;
                bVar8 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStoragePushConstant16);
                bVar10 = local_260[0x11];
                bVar41 = bVar8 | local_260[0x11];
                local_272 = EnumSet<spv::Capability>::contains
                                      (pCVar1,CapabilityStorageInputOutput16);
                bVar8 = EnumSet<spv::Capability>::contains
                                  (pCVar1,CapabilityWorkgroupMemoryExplicitLayout16BitAccessKHR);
                bVar29 = 0;
                bVar32 = 0;
                switch((int)local_40) {
                case 1:
                case 3:
                  bVar29 = local_272;
                  bVar32 = 0;
                  break;
                case 2:
                  bVar29 = local_274;
                  bVar32 = local_273;
                  break;
                case 4:
                  bVar29 = bVar8;
                  bVar32 = local_276;
                  break;
                case 5:
                case 6:
                case 7:
                case 8:
                case 10:
                case 0xb:
                  break;
                case 9:
                  bVar29 = bVar41;
                  bVar32 = bVar10;
                  break;
                case 0xc:
                  bVar29 = bVar11;
                  bVar32 = local_275;
                  break;
                default:
                  bVar32 = 0;
                }
                bVar34 = 0;
                bVar38 = 0;
                switch((int)local_38._M_nxt) {
                case 2:
                  bVar34 = local_274;
                  bVar38 = local_273;
                  break;
                case 3:
                  bVar34 = local_272;
                  bVar38 = 0;
                  break;
                case 4:
                  bVar34 = bVar8;
                  bVar38 = local_276;
                  break;
                case 5:
                case 6:
                case 7:
                case 8:
                case 10:
                case 0xb:
                  break;
                case 9:
                  bVar34 = bVar41;
                  bVar38 = bVar10;
                  break;
                case 0xc:
                  bVar34 = bVar11;
                  bVar38 = local_275;
                  break;
                default:
                  bVar34 = 0;
                  bVar38 = 0;
                }
                if ((local_260[0x12] == '\0' && (bVar29 & bVar34) == 0) && local_260[0x13] == '\0')
                {
                  ValidationState_t::diag
                            ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
                  pcVar37 = "Size must be a multiple of 4";
                }
                else {
                  if ((local_260[0x13] != '\0' || (bVar32 & bVar38) != 0) ||
                      (local_260._20_4_ & 1) == 0) goto LAB_0018e68e;
                  ValidationState_t::diag
                            ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
                  pcVar37 = "Size must be a multiple of 2";
                }
                lVar33 = 0x1c;
                goto LAB_0018c52d;
              }
            }
LAB_0018e68e:
            uVar19 = 3;
            goto LAB_0018e699;
          }
          if (uVar5 != 0x2e) goto LAB_0018da5f;
LAB_0018cf7d:
          pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
          ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,"Size operand <id> ",0x12);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
          pcVar37 = " cannot be a constant zero.";
          goto LAB_0018cfd2;
        }
        if (*(short *)((long)&(((unordered_map<unsigned_int,_spvtools::val::BasicBlock,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>_>
                                 *)(local_260._24_8_ + 0x18))->_M_h)._M_rehash_policy.
                              _M_max_load_factor + 2) != 0x20) {
          if (uVar5 != 0x20) {
            ValidationState_t::diag
                      ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
            pcVar37 = "One of Source or Target must be a typed pointer";
            goto LAB_0018bdf1;
          }
          pIVar26 = (Instruction *)0x0;
LAB_0018d8d4:
          uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar25,2);
          pIVar25 = ValidationState_t::FindDef(_,uVar13);
          if ((pIVar25 == (Instruction *)0x0) || ((pIVar25->inst_).opcode == 0x13)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_228 + 0x10),"Source operand <id> ",0x14);
            goto LAB_0018d93b;
          }
          if ((pIVar26 == (Instruction *)0x0) ||
             ((pIVar26->inst_).result_id == (pIVar25->inst_).result_id)) goto LAB_0018dbee;
          pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
          ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27,"Target <id> ",0xc);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar27,"s type does not match Source <id> ",0x22);
          uVar19 = (pIVar25->inst_).result_id;
          goto LAB_0018d1ea;
        }
        uVar13 = Instruction::GetOperandAs<unsigned_int>((Instruction *)local_260._24_8_,2);
        pIVar26 = ValidationState_t::FindDef(_,uVar13);
        if ((pIVar26 == (Instruction *)0x0) || ((pIVar26->inst_).opcode == 0x13)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_228 + 0x10),"Target operand <id> ",0x14);
          uVar15 = uVar19;
LAB_0018d93b:
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_228 + 0x10),(char *)local_298._0_8_,local_298._8_8_);
          pcVar37 = " cannot be a void pointer.";
          goto LAB_0018c4fc;
        }
        if (uVar5 == 0x20) goto LAB_0018d8d4;
LAB_0018dbee:
        uVar19 = 2;
LAB_0018e699:
        sVar20 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar19);
        if (sVar20 != SPV_SUCCESS) {
          return sVar20;
        }
        uVar3 = (inst->inst_).opcode;
        if (1 < uVar3 - 0x3f) {
          __assert_fail("inst->opcode() == spv::Op::OpCopyMemory || inst->opcode() == spv::Op::OpCopyMemorySized"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_memory.cpp"
                        ,0x4ab,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCopyMemoryMemoryAccess(ValidationState_t &, const Instruction *)"
                       );
        }
        uVar15 = uVar3 == 0x3f ^ 3;
        if ((ulong)uVar15 <
            (ulong)((long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4)) {
          sVar20 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar15);
          if (sVar20 != SPV_SUCCESS) {
            return sVar20;
          }
          uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar15);
          uVar15 = (((uVar13 >> 3 & 1) + uVar15 + (uint)((uVar13 >> 4 & 1) != 0)) -
                   (uint)((uVar13 & 2) == 0)) + 2;
          if ((ulong)uVar15 <
              (ulong)((long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
            if ((_->features_).copy_memory_permits_two_memory_accesses == true) {
              sVar20 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar15);
              if (sVar20 != SPV_SUCCESS) {
                return sVar20;
              }
              if ((uVar13 & 0x10) == 0) {
                uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar15);
                if ((uVar15 & 8) == 0) goto LAB_0018e99b;
                ValidationState_t::diag
                          ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_DATA,inst);
                pcVar37 = "Source memory access must not include MakePointerAvailableKHR";
                lVar33 = 0x3d;
              }
              else {
                ValidationState_t::diag
                          ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_DATA,inst);
                pcVar37 = "Target memory access must not include MakePointerVisibleKHR";
                lVar33 = 0x3b;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_228 + 0x10),pcVar37,lVar33);
              sVar20 = local_48;
            }
            else {
              ValidationState_t::diag
                        ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_DATA,inst);
              local_298._0_8_ = spvOpcodeString((uint)(inst->inst_).opcode);
              pDVar27 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)(local_228 + 0x10),(char **)local_298);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar27,
                         " with two memory access operands requires SPIR-V 1.4 or later",0x3d);
              sVar20 = pDVar27->error_;
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)(local_228 + 0x10));
            if (sVar20 != SPV_SUCCESS) {
              return sVar20;
            }
          }
        }
LAB_0018e99b:
        pFVar23 = (Function *)local_260._24_8_;
        if (*(short *)((long)&(((unordered_map<unsigned_int,_spvtools::val::BasicBlock,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>_>
                                 *)(local_260._24_8_ + 0x18))->_M_h)._M_rehash_policy.
                              _M_max_load_factor + 2) != 0x20) goto switchD_0018ad80_caseD_1145;
        do {
          uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)pFVar23,2);
          pFVar23 = (Function *)ValidationState_t::FindDef(_,uVar15);
        } while (*(short *)((long)&(pFVar23->blocks_)._M_h._M_rehash_policy._M_max_load_factor + 2)
                 == 0x20);
        bVar8 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if ((!bVar8) ||
           (bVar8 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                              (_,*(uint32_t *)
                                  ((long)&(pFVar23->blocks_)._M_h._M_rehash_policy._M_next_resize +
                                  4)), !bVar8)) goto switchD_0018ad80_caseD_1145;
        ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
        pcVar37 = "Cannot copy memory of objects containing 8- or 16-bit types";
LAB_0018d441:
        lVar33 = 0x3b;
        goto LAB_0018c52d;
      }
      ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
      pcVar37 = "Source operand <id> ";
      lVar33 = 0x14;
      uVar19 = uVar15;
LAB_0018befd:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_228 + 0x10),pcVar37,lVar33);
    }
LAB_0018c255:
    ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_228 + 0x10),(char *)local_298._0_8_,local_298._8_8_);
    pcVar37 = " is not defined.";
    lVar33 = 0x10;
LAB_0018c654:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_228 + 0x10),pcVar37,lVar33)
    ;
    sVar20 = local_48;
LAB_0018c66b:
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
LAB_0018c685:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)(local_228 + 0x10));
    break;
  case 0x41:
  case 0x42:
  case 0x46:
switchD_0018ad80_caseD_1143:
    sVar20 = anon_unknown_2::ValidateAccessChain(_,inst);
    break;
  case 0x43:
switchD_0018ad80_caseD_1147:
    AVar16 = ValidationState_t::addressing_model(_);
    if (((AVar16 == AddressingModelLogical) && ((inst->inst_).opcode == 0x43)) &&
       ((_->features_).variable_pointers == false)) {
      ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_228 + 0x10),"Generating variable pointers requires capability ",
                 0x31);
      pcVar37 = "VariablePointers or VariablePointersStorageBuffer";
      lVar33 = 0x31;
    }
    else {
      sVar20 = anon_unknown_2::ValidateAccessChain(_,inst);
      if (sVar20 != SPV_SUCCESS) {
        return sVar20;
      }
      bVar8 = spvOpcodeGeneratesUntypedPointer((uint)(inst->inst_).opcode);
      uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar25 = ValidationState_t::FindDef(_,uVar15);
      if (bVar8) {
        uVar19 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      }
      else {
        uVar19 = (pIVar25->inst_).type_id;
      }
      pIVar25 = ValidationState_t::FindDef(_,uVar19);
      SVar17 = Instruction::GetOperandAs<spv::StorageClass>(pIVar25,1);
      pCVar1 = &_->module_capabilities_;
      bVar9 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityShader);
      if ((!bVar9) ||
         ((((StorageBuffer < SVar17 || ((0x1204U >> (SVar17 & 0x1f) & 1) == 0)) &&
           ((SVar17 != PhysicalStorageBuffer &&
            ((bVar9 = EnumSet<spv::Capability>::contains
                                (pCVar1,CapabilityWorkgroupMemoryExplicitLayoutKHR),
             SVar17 != StorageClassWorkgroup || (!bVar9)))))) ||
          (bVar9 = ValidationState_t::HasDecoration(_,(pIVar25->inst_).result_id,ArrayStride), bVar9
          )))) {
        bVar9 = spvIsVulkanEnv(_->context_->target_env);
        if (bVar9) {
          if (bVar8) {
            bVar8 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityUntypedPointersKHR);
          }
          else {
            bVar8 = false;
          }
          if (SVar17 != PhysicalStorageBuffer) {
            if (SVar17 == StorageBuffer) {
              if (bVar8 == false && (_->features_).variable_pointers == false) {
                ValidationState_t::diag
                          ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_DATA,inst);
                ValidationState_t::VkErrorID_abi_cxx11_((string *)local_298,_,0x1de4,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_228 + 0x10),(char *)local_298._0_8_,local_298._8_8_);
                pcVar37 = 
                "OpPtrAccessChain Base operand pointing to StorageBuffer storage class must use VariablePointers or VariablePointersStorageBuffer capability"
                ;
                lVar33 = 0x8b;
                goto LAB_0018c654;
              }
            }
            else if (SVar17 == StorageClassWorkgroup) {
              bVar9 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityVariablePointers);
              if (bVar8 == false && !bVar9) {
                ValidationState_t::diag
                          ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_DATA,inst);
                ValidationState_t::VkErrorID_abi_cxx11_((string *)local_298,_,0x1de3,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_228 + 0x10),(char *)local_298._0_8_,local_298._8_8_);
                pcVar37 = 
                "OpPtrAccessChain Base operand pointing to Workgroup storage class must use VariablePointers capability"
                ;
                lVar33 = 0x66;
                goto LAB_0018c654;
              }
            }
            else if (bVar8 == false) {
              ValidationState_t::diag
                        ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_DATA,inst);
              ValidationState_t::VkErrorID_abi_cxx11_((string *)local_298,_,0x1de2,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_228 + 0x10),(char *)local_298._0_8_,local_298._8_8_);
              pcVar37 = 
              "OpPtrAccessChain Base operand must point to Workgroup, StorageBuffer, or PhysicalStorageBuffer storage class"
              ;
              lVar33 = 0x6c;
              goto LAB_0018c654;
            }
          }
        }
        goto switchD_0018ad80_caseD_1145;
      }
      ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_DATA,inst);
      pcVar37 = "OpPtrAccessChain must have a Base whose type is decorated with ArrayStride";
      lVar33 = 0x4a;
    }
LAB_0018c52d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_228 + 0x10),pcVar37,lVar33)
    ;
    sVar20 = local_48;
    goto LAB_0018c685;
  case 0x44:
switchD_0018ad80_caseD_1149:
    pcVar37 = spvOpcodeString(opcode);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_228 + 0x10),pcVar37,(allocator<char> *)local_270._M_pod_data);
    plVar22 = (long *)std::__cxx11::string::replace
                                ((ulong)(local_228 + 0x10),0,(char *)0x0,0x362138);
    local_298._0_8_ = local_298 + 0x10;
    psVar30 = (size_type *)(plVar22 + 2);
    if ((size_type *)*plVar22 == psVar30) {
      local_298._16_8_ = *psVar30;
      local_298._24_8_ = plVar22[3];
    }
    else {
      local_298._16_8_ = *psVar30;
      local_298._0_8_ = (size_type *)*plVar22;
    }
    local_298._8_8_ = plVar22[1];
    *plVar22 = (long)psVar30;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    if ((_Hash_node_base *)local_218._0_8_ != &local_208) {
      operator_delete((void *)local_218._0_8_,(ulong)((long)&(local_208._M_nxt)->_M_nxt + 1));
    }
    pIVar25 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((((pIVar25->inst_).opcode != 0x15) ||
        (uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar25,1), uVar15 != 0x20)) ||
       (uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar25,2), uVar15 != 0)) {
LAB_0018bcd8:
      pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
      ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27,"The Result Type of ",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27,(char *)local_270._M_unused._0_8_,local_270._8_8_);
      pcVar37 = " must be OpTypeInt with width 32 and signedness 0.";
      lVar33 = 0x32;
      goto LAB_0018bd5b;
    }
    uVar5 = (inst->inst_).opcode;
    uVar19 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)(uVar5 == 0x1149) | 2);
    pIVar25 = ValidationState_t::FindDef(_,uVar19);
    uVar6 = (pIVar25->inst_).opcode;
    if (uVar5 != 0x1149) {
      if (uVar6 == 0x20) goto LAB_0018cc2d;
LAB_0018cd2f:
      pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
      ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27,"The Structure\'s type in ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar27,(char *)local_270._M_unused._0_8_,local_270._8_8_);
      pcVar37 = " must be a pointer to an OpTypeStruct.";
      lVar33 = 0x26;
      goto LAB_0018bd5b;
    }
    pIVar25 = inst;
    if (uVar6 == 0x1141) {
LAB_0018cc2d:
      uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar25,2);
      pIVar25 = ValidationState_t::FindDef(_,uVar15);
      if ((pIVar25->inst_).opcode != 0x1e) goto LAB_0018cd2f;
      lVar33 = (long)(pIVar25->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pIVar25->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar25,lVar33 - 1);
      pIVar25 = ValidationState_t::FindDef(_,uVar15);
      if ((pIVar25->inst_).opcode != 0x1d) {
        pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
        ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,"The Structure\'s last member in ",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27," <id> ",6);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,(char *)local_270._M_unused._0_8_,local_270._8_8_);
        pcVar37 = " must be an OpTypeRuntimeArray.";
        lVar33 = 0x1f;
LAB_0018bd5b:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_228 + 0x10),pcVar37,lVar33);
        sVar20 = local_48;
        if ((ValidationState_t *)local_270._M_unused._0_8_ != (ValidationState_t *)local_260) {
          operator_delete(local_270._M_unused._M_object,
                          (ulong)((long)(spv_target_env *)local_260._0_8_ + 1));
        }
        goto LAB_0018bd8c;
      }
      uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)(uVar5 == 0x1149) + 3);
      sVar20 = SPV_SUCCESS;
      if (lVar33 - 2U != (ulong)uVar15) {
        pDVar27 = (DiagnosticStream *)(local_228 + 0x10);
        ValidationState_t::diag(pDVar27,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,"The array member in ",0x14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,(char *)local_298._0_8_,local_298._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar27," <id> ",6);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar27,(char *)local_270._M_unused._0_8_,local_270._8_8_);
        pcVar37 = " must be the last member of the struct.";
        lVar33 = 0x27;
        goto LAB_0018bd5b;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_228 + 0x10),"Pointer must be an untyped pointer",0x22);
      sVar20 = local_48;
LAB_0018bd8c:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)(local_228 + 0x10));
    }
LAB_0018bd91:
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
LAB_0018c91c:
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    break;
  default:
    if (uVar3 - 0x191 < 3) {
      AVar16 = ValidationState_t::addressing_model(_);
      if ((AVar16 == AddressingModelLogical) && ((_->features_).variable_pointers == false)) {
        ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
        pcVar37 = 
        "Instruction cannot for logical addressing model be used without a variable pointers capability"
        ;
        lVar33 = 0x5e;
      }
      else {
        pIVar25 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
        if ((inst->inst_).opcode == 0x193) {
          if ((pIVar25 == (Instruction *)0x0) || ((pIVar25->inst_).opcode != 0x15)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
            pcVar37 = "Result Type must be an integer scalar";
            lVar33 = 0x25;
          }
          else {
LAB_0018b5e8:
            uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,2);
            pIVar25 = ValidationState_t::FindDef(_,uVar15);
            uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,3);
            pIVar26 = ValidationState_t::FindDef(_,uVar15);
            if ((pIVar26 == (Instruction *)0x0 || pIVar25 == (Instruction *)0x0) ||
               (uVar19 = (pIVar25->inst_).type_id, uVar19 != (pIVar26->inst_).type_id)) {
              ValidationState_t::diag
                        ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
              pcVar37 = "The types of Operand 1 and Operand 2 must match";
LAB_0018bdf1:
              lVar33 = 0x2f;
            }
            else {
              pIVar25 = ValidationState_t::FindDef(_,uVar19);
              if ((pIVar25 == (Instruction *)0x0) ||
                 ((uVar5 = (pIVar25->inst_).opcode, uVar5 != 0x20 && (uVar5 != 0x1141)))) {
                ValidationState_t::diag
                          ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
                pcVar37 = "Operand type must be a pointer";
                goto LAB_0018bac8;
              }
              SVar17 = Instruction::GetOperandAs<spv::StorageClass>(pIVar25,1);
              AVar16 = ValidationState_t::addressing_model(_);
              if (AVar16 == AddressingModelLogical) {
                if ((SVar17 & ~Generic) == StorageClassWorkgroup) {
                  if ((SVar17 != StorageClassWorkgroup) ||
                     (bVar8 = EnumSet<spv::Capability>::contains
                                        (&_->module_capabilities_,CapabilityVariablePointers), bVar8
                     )) goto switchD_0018ad80_caseD_1145;
                  ValidationState_t::diag
                            ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
                  pcVar37 = 
                  "Workgroup storage class pointer requires VariablePointers capability to be specified"
                  ;
                  lVar33 = 0x54;
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
                  pcVar37 = "Invalid pointer storage class";
                  lVar33 = 0x1d;
                }
              }
              else {
                if (SVar17 != PhysicalStorageBuffer) goto switchD_0018ad80_caseD_1145;
                ValidationState_t::diag
                          ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
                pcVar37 = "Cannot use a pointer in the PhysicalStorageBuffer storage class";
                lVar33 = 0x3f;
              }
            }
          }
        }
        else {
          if ((pIVar25 != (Instruction *)0x0) && ((pIVar25->inst_).opcode == 0x14))
          goto LAB_0018b5e8;
          ValidationState_t::diag
                    ((DiagnosticStream *)(local_228 + 0x10),_,SPV_ERROR_INVALID_ID,inst);
          pcVar37 = "Result Type must be OpTypeBool";
LAB_0018bac8:
          lVar33 = 0x1e;
        }
      }
      goto LAB_0018c52d;
    }
    goto switchD_0018ad80_caseD_1145;
  }
joined_r0x0018c68c:
  if (sVar20 == SPV_SUCCESS) {
switchD_0018ad80_caseD_1145:
    sVar20 = SPV_SUCCESS;
  }
  return sVar20;
}

Assistant:

spv_result_t MemoryPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
      if (auto error = ValidateVariable(_, inst)) return error;
      break;
    case spv::Op::OpLoad:
      if (auto error = ValidateLoad(_, inst)) return error;
      break;
    case spv::Op::OpStore:
      if (auto error = ValidateStore(_, inst)) return error;
      break;
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
      if (auto error = ValidateCopyMemory(_, inst)) return error;
      break;
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpUntypedPtrAccessChainKHR:
    case spv::Op::OpUntypedInBoundsPtrAccessChainKHR:
      if (auto error = ValidatePtrAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
    case spv::Op::OpUntypedAccessChainKHR:
    case spv::Op::OpUntypedInBoundsAccessChainKHR:
      if (auto error = ValidateAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpRawAccessChainNV:
      if (auto error = ValidateRawAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpArrayLength:
    case spv::Op::OpUntypedArrayLengthKHR:
      if (auto error = ValidateArrayLength(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadNV:
    case spv::Op::OpCooperativeMatrixStoreNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLengthKHR:
    case spv::Op::OpCooperativeMatrixLengthNV:
      if (auto error = ValidateCooperativeMatrixLengthNV(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadKHR:
    case spv::Op::OpCooperativeMatrixStoreKHR:
      if (auto error = ValidateCooperativeMatrixLoadStoreKHR(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadTensorNV:
    case spv::Op::OpCooperativeMatrixStoreTensorNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreTensorNV(_, inst))
        return error;
      break;
    case spv::Op::OpPtrEqual:
    case spv::Op::OpPtrNotEqual:
    case spv::Op::OpPtrDiff:
      if (auto error = ValidatePtrComparison(_, inst)) return error;
      break;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpGenericPtrMemSemantics:
    default:
      break;
  }

  return SPV_SUCCESS;
}